

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleStringsCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  BOM BVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  string *psVar11;
  ostream *poVar12;
  ulong uVar13;
  uint *puVar14;
  ulong uVar15;
  BOM BVar16;
  undefined1 uVar17;
  uint uVar18;
  int iVar19;
  ulong unaff_RBP;
  char cVar20;
  pointer pbVar21;
  undefined4 uVar22;
  size_type sVar23;
  string *sr;
  undefined4 uVar24;
  int limit_output;
  string output;
  int limit_input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  string outVar;
  string s;
  ifstream fin;
  RegularExpression regex;
  int local_54c;
  pointer local_548;
  uint local_540;
  uint local_53c;
  string local_538;
  ulong local_518;
  uint local_510;
  int local_50c;
  ulong local_508;
  ulong local_500;
  ulong local_4f8;
  ulong local_4f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  string local_4d0;
  uint local_4ac;
  ulong local_4a8;
  string local_4a0;
  undefined1 local_480 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470 [6];
  ios_base local_410 [264];
  undefined1 local_308 [32];
  uint auStack_2e8 [20];
  ios_base local_298 [408];
  RegularExpression local_100;
  
  pbVar21 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar21) < 0x41) {
    local_308._0_8_ = local_308 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_308,"STRINGS requires a file name and output variable","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_308);
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
    }
    return (bool)0;
  }
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  pcVar1 = pbVar21[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d0,pcVar1,pcVar1 + pbVar21[1]._M_string_length);
  bVar3 = cmsys::SystemTools::FileIsFullPath(&local_4d0);
  if (!bVar3) {
    cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::_M_assign((string *)&local_4d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                   "/",(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::_M_append((char *)&local_4d0,local_308._0_8_);
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
    }
  }
  pbVar21 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  pcVar1 = pbVar21[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a0,pcVar1,pcVar1 + pbVar21[2]._M_string_length);
  local_50c = -1;
  local_54c = -1;
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_4f8 = 0;
  local_100.program = (char *)0x0;
  pbVar21 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_53c = 0;
  local_540 = 0;
  local_4f0 = 0;
  local_500 = 0;
  BVar16 = BOM_None;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar21) < 0x61) {
LAB_0019333a:
    psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    pcVar1 = (psVar11->_M_dataplus)._M_p;
    local_308._0_8_ = local_308 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_308,pcVar1,pcVar1 + psVar11->_M_string_length);
    std::__cxx11::string::append(local_308);
    std::__cxx11::string::append(local_308);
    bVar3 = cmHexFileConverter::TryConvert(&local_4d0,(string *)local_308);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&local_4d0);
    }
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
    }
  }
  else {
    bVar3 = true;
    unaff_RBP = 3;
    local_508 = local_508 & 0xffffffff00000000;
    local_53c = 0;
    local_540 = 0;
    uVar22 = 0;
    local_548 = (pointer)((ulong)local_548 & 0xffffffff00000000);
    local_4f0 = 0;
    local_500 = 0;
    do {
      uVar15 = unaff_RBP;
      unaff_RBP = (ulong)((int)unaff_RBP + 1);
      uVar24 = uVar22;
      while( true ) {
        iVar5 = std::__cxx11::string::compare((char *)(pbVar21 + uVar15));
        if (iVar5 == 0) break;
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar15));
        if (iVar5 == 0) {
          uVar22 = 2;
          goto LAB_00193129;
        }
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar15));
        if (iVar5 == 0) {
          uVar22 = 3;
          goto LAB_00193129;
        }
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar15));
        if (iVar5 == 0) {
          uVar22 = 4;
          goto LAB_00193129;
        }
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar15));
        if (iVar5 == 0) {
          uVar22 = 5;
          goto LAB_00193129;
        }
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar15));
        if (iVar5 == 0) {
          uVar22 = 7;
          goto LAB_00193129;
        }
        uVar10 = std::__cxx11::string::compare
                           ((char *)((args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + uVar15));
        uVar22 = 0;
        if ((int)uVar10 == 0) {
          local_4f0 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
          uVar22 = 0;
          goto LAB_00193129;
        }
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar15));
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar15));
          if (iVar5 == 0) {
            uVar22 = 8;
            goto LAB_00193129;
          }
          puVar14 = &switchD_001930ef::switchdataD_004e9f24;
          switch(uVar24) {
          case 1:
            uVar22 = 0;
            iVar5 = __isoc99_sscanf((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus.
                                    _M_p,"%d",&local_50c);
            if ((iVar5 == 1) && (-1 < local_50c)) goto LAB_00193129;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_308,"STRINGS option LIMIT_INPUT value \"",0x22);
            pbVar21 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_308,pbVar21[uVar15]._M_dataplus._M_p,
                                 pbVar21[uVar15]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" is not an unsigned integer.",0x1d);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
            break;
          case 2:
            uVar22 = 0;
            iVar5 = __isoc99_sscanf((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus.
                                    _M_p,"%d",&local_54c);
            if ((iVar5 == 1) && (-1 < local_54c)) goto LAB_00193129;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_308,"STRINGS option LIMIT_OUTPUT value \"",0x23);
            pbVar21 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_308,pbVar21[uVar15]._M_dataplus._M_p,
                                 pbVar21[uVar15]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" is not an unsigned integer.",0x1d);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
            break;
          case 3:
            iVar5 = __isoc99_sscanf((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus.
                                    _M_p,"%d",&local_538);
            if (iVar5 == 1) {
              local_540 = (uint)local_538._M_dataplus._M_p;
              if (-1 < (int)(uint)local_538._M_dataplus._M_p) goto LAB_00193129;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_308,"STRINGS option LIMIT_COUNT value \"",0x22);
            pbVar21 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_308,pbVar21[uVar15]._M_dataplus._M_p,
                                 pbVar21[uVar15]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" is not an unsigned integer.",0x1d);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
            break;
          case 4:
            iVar5 = __isoc99_sscanf((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus.
                                    _M_p,"%d",&local_538);
            if ((iVar5 == 1) && (-1 < (int)(uint)local_538._M_dataplus._M_p)) {
              local_508 = CONCAT44(local_508._4_4_,(uint)local_538._M_dataplus._M_p);
              goto LAB_00193129;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_308,"STRINGS option LENGTH_MINIMUM value \"",0x25);
            pbVar21 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_308,pbVar21[uVar15]._M_dataplus._M_p,
                                 pbVar21[uVar15]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" is not an unsigned integer.",0x1d);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
            break;
          case 5:
            iVar5 = __isoc99_sscanf((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus.
                                    _M_p,"%d",&local_538);
            if (iVar5 == 1) {
              local_53c = (uint)local_538._M_dataplus._M_p;
              if (-1 < (int)(uint)local_538._M_dataplus._M_p) goto LAB_00193129;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_308,"STRINGS option LENGTH_MAXIMUM value \"",0x25);
            pbVar21 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_308,pbVar21[uVar15]._M_dataplus._M_p,
                                 pbVar21[uVar15]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" is not an unsigned integer.",0x1d);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
            break;
          default:
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_308,"STRINGS given unknown argument \"",0x20);
            pbVar21 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_308,pbVar21[uVar15]._M_dataplus._M_p,
                                 pbVar21[uVar15]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"",1);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
            break;
          case 7:
            bVar4 = cmsys::RegularExpression::compile
                              (&local_100,
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p);
            local_500 = CONCAT71((int7)((ulong)puVar14 >> 8),1);
            if (bVar4) goto LAB_00193129;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_308,"STRINGS option REGEX value \"",0x1c);
            pbVar21 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_308,pbVar21[uVar15]._M_dataplus._M_p,
                                 pbVar21[uVar15]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" could not be compiled.",0x18);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
            break;
          case 8:
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar15));
            if (iVar5 == 0) {
              local_548 = (pointer)CONCAT44(local_548._4_4_,1);
              goto LAB_00193129;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar15));
            if (iVar5 == 0) {
              local_548 = (pointer)CONCAT44(local_548._4_4_,3);
              goto LAB_00193129;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar15));
            if (iVar5 == 0) {
              local_548 = (pointer)CONCAT44(local_548._4_4_,2);
              goto LAB_00193129;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar15));
            if (iVar5 == 0) {
              local_548 = (pointer)CONCAT44(local_548._4_4_,5);
              goto LAB_00193129;
            }
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar15));
            local_548 = (pointer)CONCAT44(local_548._4_4_,4);
            uVar22 = 0;
            if (iVar5 == 0) goto LAB_00193129;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_308,"STRINGS option ENCODING \"",0x19);
            pbVar21 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_308,pbVar21[uVar15]._M_dataplus._M_p,
                                 pbVar21[uVar15]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" not recognized.",0x11);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_480);
          }
          if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
            operator_delete((void *)local_480._0_8_,
                            CONCAT71(local_470[0]._M_allocated_capacity._1_7_,
                                     local_470[0]._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
          std::ios_base::~ios_base(local_298);
          uVar17 = 0;
          goto LAB_00193b0e;
        }
        pbVar21 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar13 = (ulong)((int)unaff_RBP + 1);
        uVar24 = 0;
        bVar3 = false;
        bVar4 = (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar21 >> 5) <=
                unaff_RBP;
        uVar15 = unaff_RBP;
        unaff_RBP = uVar13;
        if (bVar4) {
          local_4f8 = local_508 & 0xffffffff;
          BVar16 = (BOM)local_548;
          goto LAB_001933d9;
        }
      }
      uVar22 = 1;
LAB_00193129:
      pbVar21 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (unaff_RBP <
             (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar21 >> 5));
    local_4f8 = local_508 & 0xffffffff;
    BVar16 = (BOM)local_548;
    if (bVar3) goto LAB_0019333a;
  }
LAB_001933d9:
  std::ifstream::ifstream(local_308,local_4d0._M_dataplus._M_p,_S_in);
  uVar9 = local_540;
  bVar3 = (*(byte *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) == 0;
  uVar15 = CONCAT71((int7)(unaff_RBP >> 8),bVar3);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_480);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_480,"STRINGS file \"",0xe);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_480,local_4d0._M_dataplus._M_p,local_4d0._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" cannot be read.",0x11);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_538);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,
                      CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                               local_538.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_480);
    std::ios_base::~ios_base(local_410);
    goto LAB_00193b01;
  }
  local_510 = (uint)uVar15;
  BVar6 = cmsys::FStream::ReadBOM((istream *)local_308);
  if (BVar6 == BOM_None) {
    BVar6 = BVar16;
  }
  if (BVar16 != BOM_None) {
    BVar6 = BVar16;
  }
  local_548 = (pointer)CONCAT44(local_548._4_4_,BVar6);
  local_4ac = 3;
  if ((BVar6 & ~BOM_UTF8) != BOM_UTF32BE) {
    local_4ac = (uint)((BVar6 & ~BOM_UTF8) == BOM_UTF16BE);
  }
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_480._0_8_ = local_480 + 0x10;
  local_480._8_8_ = 0;
  local_470[0]._M_local_buf[0] = '\0';
  local_4a8 = (ulong)uVar9;
  local_518 = 0;
  local_508 = (ulong)local_53c;
  do {
    if ((uVar9 != 0) &&
       (uVar13 = (long)local_4e8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_4e8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5, local_4a8 <= uVar13))
    goto LAB_00193986;
    if (((-1 < local_50c) && (iVar5 = std::istream::tellg(), local_50c <= iVar5)) ||
       ((*(byte *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) != 0)) break;
    local_538._M_string_length = 0;
    local_538.field_2._M_local_buf[0] = '\0';
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    uVar7 = std::istream::get();
    cVar20 = (char)local_308;
    for (uVar18 = local_4ac; uVar18 != 0; uVar18 = uVar18 - 1) {
      uVar8 = std::istream::get();
      if ((*(byte *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) != 0) {
        std::istream::putback(cVar20);
        break;
      }
      uVar7 = uVar7 << 8 | uVar8;
    }
    uVar15 = local_508;
    if ((BOM)local_548 == 5) {
      uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    }
    else if ((BOM)local_548 == 3) {
      uVar7 = (uint)(ushort)((ushort)uVar7 << 8 | (ushort)uVar7 >> 8);
    }
    if (uVar7 == 0xd) {
      bVar3 = false;
    }
    else {
      if (uVar7 < 0x100) {
        iVar5 = isprint(uVar7);
        if (((uVar7 != 9) && (iVar5 == 0)) && ((uVar7 == 10 & (byte)local_4f0) == 0))
        goto LAB_00193673;
        std::__cxx11::string::push_back((char)&local_538);
      }
      else {
LAB_00193673:
        if ((BOM)local_548 == 1) {
          uVar15 = 0;
          iVar5 = 2;
          do {
            iVar19 = iVar5;
            uVar9 = HandleStringsCommand::utf8_check_table[uVar15][0] & uVar7;
            uVar13 = uVar15 + 1;
            uVar18 = (uint)HandleStringsCommand::utf8_check_table[uVar15][1];
            if (uVar9 == uVar18) break;
            bVar3 = uVar15 < 2;
            uVar15 = uVar13;
            iVar5 = iVar19 + 1;
          } while (bVar3);
          uVar8 = (int)uVar13 + 1;
          if (uVar9 != uVar18) {
            uVar8 = 0;
          }
          if (uVar9 == uVar18) {
            iVar5 = 0;
            do {
              bVar3 = iVar5 != 0;
              iVar5 = iVar5 + -1;
              if ((bVar3) &&
                 ((uVar7 = std::istream::get(), (uVar7 & 0xc0) != 0x80 ||
                  ((*(uint *)((long)auStack_2e8 + *(long *)(local_308._0_8_ + -0x18)) & 5) != 0))))
              {
                std::istream::putback(cVar20);
                break;
              }
              std::__cxx11::string::push_back((char)&local_538);
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
          uVar9 = local_540;
          uVar15 = local_508;
          if (local_538._M_string_length != uVar8) {
            if (local_538._M_string_length != 1) {
              uVar15 = 0;
              uVar13 = 1;
              do {
                uVar7 = (uint)local_538._M_dataplus._M_p[~uVar15 + local_538._M_string_length];
                std::istream::putback(cVar20);
                bVar3 = uVar13 < local_538._M_string_length - 1;
                uVar15 = uVar13;
                uVar13 = (ulong)((int)uVar13 + 1);
              } while (bVar3);
            }
            local_538._M_string_length = 0;
            *local_538._M_dataplus._M_p = '\0';
            uVar15 = local_508;
          }
        }
      }
      if (uVar7 == 10 && (local_4f0 & 1) == 0) {
        if (((ulong)local_480._8_8_ < local_4f8) ||
           (((local_500 & 1) != 0 &&
            (bVar3 = cmsys::RegularExpression::find
                               (&local_100,(char *)local_480._0_8_,&local_100.regmatch), !bVar3))))
        {
LAB_001938ab:
          local_480._8_8_ = 0;
          *(char *)local_480._0_8_ = '\0';
          goto LAB_001938c2;
        }
        uVar7 = (int)local_518 + (int)local_480._8_8_ + 1;
        local_518 = (ulong)uVar7;
        if ((local_54c < 0) || (bVar3 = true, (int)uVar7 < local_54c)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4e8,(value_type *)local_480);
          goto LAB_001938ab;
        }
      }
      else {
        if (local_538._M_string_length == 0) {
          if ((local_480._8_8_ != 0 && local_4f8 <= (ulong)local_480._8_8_) &&
             (((local_500 & 1) == 0 ||
              (bVar3 = cmsys::RegularExpression::find
                                 (&local_100,(char *)local_480._0_8_,&local_100.regmatch), bVar3))))
          {
            uVar7 = (int)local_518 + (int)local_480._8_8_ + 1;
            local_518 = (ulong)uVar7;
            if ((-1 < local_54c) && (bVar3 = true, local_54c <= (int)uVar7)) goto LAB_0019393d;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_4e8,(value_type *)local_480);
          }
          goto LAB_001938ab;
        }
        std::__cxx11::string::_M_append(local_480,(ulong)local_538._M_dataplus._M_p);
LAB_001938c2:
        bVar3 = false;
        if ((local_53c == 0) || (local_480._8_8_ != uVar15)) goto LAB_00193954;
        if ((uint)local_4f8 <= (uint)uVar15) {
          uVar7 = local_53c;
          if ((local_500 & 1) != 0) {
            bVar3 = cmsys::RegularExpression::find
                              (&local_100,(char *)local_480._0_8_,&local_100.regmatch);
            if (!bVar3) goto LAB_0019393b;
            uVar7 = local_480._8_4_;
          }
          uVar7 = (int)local_518 + uVar7 + 1;
          local_518 = (ulong)uVar7;
          if ((-1 < local_54c) && (bVar3 = true, local_54c <= (int)uVar7)) goto LAB_0019393d;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_4e8,(value_type *)local_480);
        }
LAB_0019393b:
        bVar3 = false;
      }
LAB_0019393d:
      local_480._8_8_ = 0;
      *(char *)local_480._0_8_ = '\0';
    }
LAB_00193954:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,
                      CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                               local_538.field_2._M_local_buf[0]) + 1);
    }
  } while (!bVar3);
  if (uVar9 == 0) {
    uVar15 = (ulong)local_510;
    iVar5 = (int)local_518;
LAB_001939ac:
    if ((((local_480._8_8_ != 0) && (local_4f8 <= (ulong)local_480._8_8_)) &&
        (((local_500 & 1) == 0 ||
         (bVar3 = cmsys::RegularExpression::find
                            (&local_100,(char *)local_480._0_8_,&local_100.regmatch), bVar3)))) &&
       ((local_54c < 0 || (local_480._8_4_ + iVar5 + 1 < local_54c)))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_4e8,(value_type *)local_480);
    }
  }
  else {
    uVar13 = (long)local_4e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_4e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
LAB_00193986:
    uVar15 = (ulong)local_510;
    iVar5 = (int)local_518;
    if (uVar13 < local_4a8) goto LAB_001939ac;
  }
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  local_538._M_string_length = 0;
  local_538.field_2._M_local_buf[0] = '\0';
  local_548 = local_4e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar21 = local_4e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__cxx11::string::append((char *)&local_538);
      sVar2 = pbVar21->_M_string_length;
      if (sVar2 != 0) {
        pcVar1 = (pbVar21->_M_dataplus)._M_p;
        sVar23 = 0;
        do {
          cVar20 = (char)&local_538;
          if (pcVar1[sVar23] == ';') {
            std::__cxx11::string::push_back(cVar20);
          }
          std::__cxx11::string::push_back(cVar20);
          sVar23 = sVar23 + 1;
        } while (sVar2 != sVar23);
      }
      pbVar21 = pbVar21 + 1;
    } while (pbVar21 != local_548);
    uVar15 = (ulong)local_510;
  }
  cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_4a0,local_538._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,
                    CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                             local_538.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
    operator_delete((void *)local_480._0_8_,
                    CONCAT71(local_470[0]._M_allocated_capacity._1_7_,local_470[0]._M_local_buf[0])
                    + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4e8);
LAB_00193b01:
  uVar17 = (undefined1)uVar15;
  std::ifstream::~ifstream(local_308);
LAB_00193b0e:
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  return (bool)uVar17;
}

Assistant:

bool cmFileCommand::HandleStringsCommand(std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + args[1];
  }

  // Get the variable in which to store the results.
  std::string outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg__maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_INPUT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_OUTPUT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        std::ostringstream e;
        e << "STRINGS option LIMIT_COUNT value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MINIMUM value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        std::ostringstream e;
        e << "STRINGS option LENGTH_MAXIMUM value \"" << args[i]
          << "\" is not an unsigned integer.";
        this->SetError(e.str());
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        std::ostringstream e;
        e << "STRINGS option REGEX value \"" << args[i]
          << "\" could not be compiled.";
        this->SetError(e.str());
        return false;
      }
      have_regex = true;
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        std::ostringstream e;
        e << "STRINGS option ENCODING \"" << args[i] << "\" not recognized.";
        this->SetError(e.str());
        return false;
      }
      arg_mode = arg_none;
    } else {
      std::ostringstream e;
      e << "STRINGS given unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName = this->Makefile->GetCurrentBinaryDirectory();
    binaryFileName += "/CMakeFiles";
    binaryFileName += "/FileCommandStringsBinaryFile";
    if (cmHexFileConverter::TryConvert(fileName, binaryFileName)) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    std::ostringstream e;
    e << "STRINGS file \"" << fileName << "\" cannot be read.";
    this->SetError(e.str());
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          c = current_str[current_str.size() - 1 - j];
          fin.putback(static_cast<char>(c));
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  this->Makefile->AddDefinition(outVar, output.c_str());
  return true;
}